

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralLinearActionVarying::~IfcStructuralLinearActionVarying
          (IfcStructuralLinearActionVarying *this,void **vtt)

{
  undefined1 *puVar1;
  void *pvVar2;
  pointer pLVar3;
  undefined1 *puVar4;
  
  pvVar2 = *vtt;
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.super_IfcProduct.super_IfcObject = pvVar2;
  *(void **)(&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
              super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0x0 +
            *(long *)((long)pvVar2 + -0x18)) = vtt[0x34];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0x88 = vtt[0x35];
  (this->super_IfcStructuralLinearAction).super_IfcStructuralAction.super_IfcStructuralActivity.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0x36];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0xd0 = vtt[0x37];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.super_IfcProduct.field_0x100 = vtt[0x38];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.field_0x138 = vtt[0x39];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.field_0x178 =
       vtt[0x3a];
  *(void **)&(this->super_IfcStructuralLinearAction).field_0x1a8 = vtt[0x3b];
  pLVar3 = (this->SubsequentAppliedLoads).
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar3 != (pointer)0x0) {
    operator_delete(pLVar3,(long)(this->SubsequentAppliedLoads).
                                 super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
                                 .
                                 super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar3);
  }
  pvVar2 = vtt[1];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.super_IfcProduct.super_IfcObject = pvVar2;
  *(void **)(&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
              super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0x0 +
            *(long *)((long)pvVar2 + -0x18)) = vtt[0x2b];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0x88 = vtt[0x2c];
  (this->super_IfcStructuralLinearAction).super_IfcStructuralAction.super_IfcStructuralActivity.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0x2d];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0xd0 = vtt[0x2e];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.super_IfcProduct.field_0x100 = vtt[0x2f];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.field_0x138 = vtt[0x30];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.field_0x178 =
       vtt[0x31];
  puVar4 = *(undefined1 **)
            &(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.field_0x188;
  puVar1 = &(this->super_IfcStructuralLinearAction).field_0x198;
  if (puVar4 != puVar1) {
    operator_delete(puVar4,*(long *)puVar1 + 1);
  }
  pvVar2 = vtt[2];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.super_IfcProduct.super_IfcObject = pvVar2;
  *(void **)(&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
              super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0x0 +
            *(long *)((long)pvVar2 + -0x18)) = vtt[0x23];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0x88 = vtt[0x24];
  (this->super_IfcStructuralLinearAction).super_IfcStructuralAction.super_IfcStructuralActivity.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0x25];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0xd0 = vtt[0x26];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.super_IfcProduct.field_0x100 = vtt[0x27];
  *(void **)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.field_0x138 = vtt[0x28];
  puVar4 = *(undefined1 **)
            &(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.
             super_IfcStructuralActivity.field_0x148;
  puVar1 = &(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.field_0x158;
  if (puVar4 != puVar1) {
    operator_delete(puVar4,*(long *)puVar1 + 1);
  }
  IfcStructuralActivity::~IfcStructuralActivity((IfcStructuralActivity *)this,vtt + 3);
  return;
}

Assistant:

IfcStructuralLinearActionVarying() : Object("IfcStructuralLinearActionVarying") {}